

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ops-h2.c
# Opt level: O1

int rops_destroy_role_h2(lws *wsi)

{
  int *piVar1;
  char cVar2;
  lws_context *plVar3;
  undefined8 *puVar4;
  lws_h2_netconn *ptr;
  long lVar5;
  
  plVar3 = wsi->context;
  cVar2 = wsi->tsi;
  _lws_log(8,"%s: wsi %p: ah det due to close\n","rops_destroy_role_h2",wsi);
  __lws_header_table_detach(wsi,0);
  lVar5 = (long)cVar2 * 0x188;
  puVar4 = *(undefined8 **)((long)&plVar3->set + lVar5 + -0x78);
  do {
    if (puVar4 == (undefined8 *)0x0) {
LAB_00134d75:
      if ((wsi->field_0x2dc & 6) != 0) {
        lws_hpack_destroy_dynamic_header(wsi);
        ptr = (wsi->h2).h2n;
        if (ptr != (lws_h2_netconn *)0x0) {
          lws_realloc(ptr,0,"free");
          (wsi->h2).h2n = (lws_h2_netconn *)0x0;
        }
      }
      return 0;
    }
    if ((*(char *)((long)puVar4 + 0x3c2) != '\0') && ((lws *)puVar4[1] == wsi)) {
      _lws_log(1,"%s: ah leak: wsi %p\n","rops_destroy_role_h2",wsi);
      *(undefined1 *)((long)puVar4 + 0x3c2) = 0;
      puVar4[1] = 0;
      piVar1 = (int *)((long)&plVar3->set + lVar5 + -0x60);
      *piVar1 = *piVar1 + -1;
      goto LAB_00134d75;
    }
    puVar4 = (undefined8 *)*puVar4;
  } while( true );
}

Assistant:

static int
rops_destroy_role_h2(struct lws *wsi)
{
	struct lws_context_per_thread *pt = &wsi->context->pt[(int)wsi->tsi];
	struct allocated_headers *ah;

	/* we may not have an ah, but may be on the waiting list... */
	lwsl_info("%s: wsi %p: ah det due to close\n", __func__, wsi);
	__lws_header_table_detach(wsi, 0);

	ah = pt->http.ah_list;

	while (ah) {
		if (ah->in_use && ah->wsi == wsi) {
			lwsl_err("%s: ah leak: wsi %p\n", __func__, wsi);
			ah->in_use = 0;
			ah->wsi = NULL;
			pt->http.ah_count_in_use--;
			break;
		}
		ah = ah->next;
	}

#if defined(LWS_WITH_HTTP_STREAM_COMPRESSION)
	lws_http_compression_destroy(wsi);
#endif

	if (wsi->upgraded_to_http2 || wsi->mux_substream) {
		lws_hpack_destroy_dynamic_header(wsi);

		if (wsi->h2.h2n)
			lws_free_set_NULL(wsi->h2.h2n);
	}

	return 0;
}